

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O3

uint8_t * __thiscall
cdns::dump_block_parameters
          (cdns *this,uint8_t *in,uint8_t *in_max,char *out_buf,char *out_max,int cdns_version,
          int *err,FILE *F_out)

{
  long lVar1;
  byte bVar2;
  int64_t iVar3;
  byte *in_00;
  uint8_t *in_01;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  char *pcVar7;
  int iVar8;
  uint uVar9;
  bool bVar10;
  int64_t inner_val;
  int64_t local_58;
  long local_50;
  uint local_48;
  undefined4 uStack_44;
  char *local_40;
  char *local_38;
  
  bVar2 = *in >> 5;
  local_40 = out_max;
  in_00 = cbor_get_number(in,in_max,&local_58);
  if (((cdns_version == 0) && (in_00 != (byte *)0x0)) && (bVar2 == 5)) {
    fwrite("[\n",2,1,(FILE *)F_out);
    iVar3 = local_58;
    if (local_58 == -1) {
      local_58 = 0xffffffff;
    }
    if (in_max <= in_00 || local_58 < 1) goto LAB_00155408;
    local_50 = iVar3;
    iVar8 = 0;
    do {
      bVar2 = *in_00;
      if (bVar2 == 0xff) {
        fwrite("\n            --end of array",0x1b,1,(FILE *)F_out);
        if (local_50 != -1) {
          pcVar7 = "            Error, end of array mark unexpected.\n";
          sVar6 = 0x31;
LAB_001553dd:
          fwrite(pcVar7,sVar6,1,(FILE *)F_out);
          *err = -3;
          return (uint8_t *)0x0;
        }
        in_00 = in_00 + 1;
        goto LAB_00155408;
      }
      in_01 = cbor_get_number(in_00,in_max,(int64_t *)&local_48);
      if (0x1f < bVar2) {
        uVar5 = (ulong)(bVar2 >> 5);
        uVar4 = (ulong)local_48;
        pcVar7 = "        Unexpected type: %d(%d)\n";
        goto LAB_0015538f;
      }
      bVar10 = iVar8 != 0;
      iVar8 = iVar8 + -1;
      if (bVar10) {
        fwrite(",\n",2,1,(FILE *)F_out);
      }
      local_38 = out_buf;
      switch(CONCAT44(uStack_44,local_48)) {
      case 0:
        sVar6 = 0x1c;
        pcVar7 = "            --query-timeout\n";
        break;
      case 1:
        sVar6 = 0x1b;
        pcVar7 = "            --skew-timeout\n";
        break;
      case 2:
        sVar6 = 0x16;
        pcVar7 = "            --snaplen\n";
        break;
      case 3:
        sVar6 = 0x16;
        pcVar7 = "            --promisc\n";
        break;
      case 4:
        sVar6 = 0x19;
        pcVar7 = "            --interfaces\n";
        break;
      case 5:
        sVar6 = 0x1f;
        pcVar7 = "            --server-addresses\n";
        break;
      case 6:
        sVar6 = 0x17;
        pcVar7 = "            --vlan-ids\n";
        break;
      case 7:
        sVar6 = 0x15;
        pcVar7 = "            --filter\n";
        break;
      case 8:
        sVar6 = 0x1c;
        pcVar7 = "            --query-options\n";
        break;
      case 9:
        sVar6 = 0x1f;
        pcVar7 = "            --response-options\n";
        break;
      case 10:
        sVar6 = 0x1e;
        pcVar7 = "            --accept-rr-types\n";
        break;
      case 0xb:
        sVar6 = 0x1e;
        pcVar7 = "            --ignore-rr-types\n";
        break;
      case 0xc:
        sVar6 = 0x21;
        pcVar7 = "            --max-block-qr-items\n";
        break;
      default:
        goto switchD_0015509d_default;
      }
      fwrite(pcVar7,sVar6,1,(FILE *)F_out);
switchD_0015509d_default:
      fprintf((FILE *)F_out,"            %d,",(ulong)local_48);
      in_00 = cbor_to_text(in_01,in_max,&local_38,local_40,err);
      fwrite(out_buf,1,(long)local_38 - (long)out_buf,(FILE *)F_out);
      lVar1 = local_58 + -1;
    } while (((in_00 < in_max) && (in_00 != (byte *)0x0)) &&
            (bVar10 = 1 < local_58, local_58 = lVar1, bVar10));
  }
  else {
    if (((cdns_version != 1) || (in_00 == (byte *)0x0)) || (bVar2 != 4)) {
      pcVar7 = 
      "       Error, cannot parse the first bytes of block parameters (version %d), type %d.\n";
      uVar5 = (ulong)(uint)cdns_version;
      uVar4 = (ulong)bVar2;
LAB_0015538f:
      fprintf((FILE *)F_out,pcVar7,uVar5,uVar4);
      *err = -3;
      return (uint8_t *)0x0;
    }
    fwrite(" [\n",3,1,(FILE *)F_out);
    iVar3 = local_58;
    if (local_58 == -1) {
      local_58 = 0xffffffff;
    }
    if (in_max <= in_00 || local_58 < 1) goto LAB_00155408;
    local_50 = iVar3;
    uVar9 = 0;
    do {
      if (*in_00 == 0xff) {
        fwrite("        --end of array",0x16,1,(FILE *)F_out);
        if (local_50 != -1) {
          pcVar7 = "        Error, end of array mark unexpected.\n";
          sVar6 = 0x2d;
          goto LAB_001553dd;
        }
        in_00 = in_00 + 1;
        goto LAB_00155408;
      }
      fprintf((FILE *)F_out,"            -- Block parameter %d:\n",(ulong)uVar9);
      in_00 = dump_block_parameters_rfc(this,in_00,in_max,out_buf,local_40,err,F_out);
      lVar1 = local_58 + -1;
    } while (((in_00 < in_max) && (in_00 != (byte *)0x0)) &&
            (uVar9 = uVar9 + 1, bVar10 = 1 < local_58, local_58 = lVar1, bVar10));
  }
  local_58 = lVar1;
  if (in_00 == (byte *)0x0) {
    return (uint8_t *)0x0;
  }
LAB_00155408:
  fwrite("\n        ]",10,1,(FILE *)F_out);
  return in_00;
}

Assistant:

uint8_t* cdns::dump_block_parameters(uint8_t* in, uint8_t* in_max, char* out_buf, char* out_max, int cdns_version, int* err, FILE* F_out)
{
    char* p_out;
    int64_t val;
    int outer_type = CBOR_CLASS(*in);
    int is_undef = 0;

    in = cbor_get_number(in, in_max, &val);

    if (in != NULL && outer_type == CBOR_T_MAP && cdns_version == 0) {
        /* Input is in draft-04 format */
        int rank = 0;
        fprintf(F_out, "[\n");
        if (val == CBOR_END_OF_ARRAY) {
            is_undef = 1;
            val = 0xffffffff;
        }

        while (val > 0 && in != NULL && in < in_max) {
            if (*in == 0xff) {
                fprintf(F_out, "\n            --end of array");
                if (is_undef) {
                    in++;
                }
                else {
                    fprintf(F_out, "            Error, end of array mark unexpected.\n");
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                break;
            }
            else {
                /* There should be two elements for each map item */
                int inner_type = CBOR_CLASS(*in);
                int64_t inner_val;

                in = cbor_get_number(in, in_max, &inner_val);
                if (inner_type != CBOR_T_UINT) {
                    fprintf(F_out, "        Unexpected type: %d(%d)\n", inner_type, (int)inner_val);
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                else {
                    if (rank != 0) {
                        fprintf(F_out, ",\n");
                    }
                    rank++;
                    {
                        /* Type definitions copies fro source code of compactor */
                        p_out = out_buf;
                        if (inner_val == 0) {
                            fprintf(F_out, "            --query-timeout\n");
                        }
                        else if (inner_val == 1) {
                            fprintf(F_out, "            --skew-timeout\n");
                        }
                        else if (inner_val == 2) {
                            fprintf(F_out, "            --snaplen\n");
                        }
                        else if (inner_val == 3) {
                            fprintf(F_out, "            --promisc\n");
                        }
                        else if (inner_val == 4) {
                            fprintf(F_out, "            --interfaces\n"); /* V0.5 only? */
                        }
                        else if (inner_val == 5) {
                            fprintf(F_out, "            --server-addresses\n"); /* v0.5 only? */
                        }
                        else if (inner_val == 6) {
                            fprintf(F_out, "            --vlan-ids\n"); /* v0.5 only? */
                        }
                        else if (inner_val == 7) {
                            fprintf(F_out, "            --filter\n"); /* v0.5 only? */
                        }
                        else if (inner_val == 8) {
                            fprintf(F_out, "            --query-options\n"); /* v0.5 only? */
                        }
                        else if (inner_val == 9) {
                            fprintf(F_out, "            --response-options\n"); /* v0.5 only? */
                        }
                        else if (inner_val == 10) {
                            fprintf(F_out, "            --accept-rr-types\n"); /* v0.5 only? */
                        }
                        else if (inner_val == 11) {
                            fprintf(F_out, "            --ignore-rr-types\n"); /* v0.5 only? */
                        }
                        else if (inner_val == 12) {
                            fprintf(F_out, "            --max-block-qr-items\n"); /* v0.5 only? */
                        }
                        fprintf(F_out, "            %d,", (int)inner_val);
                        in = cbor_to_text(in, in_max, &p_out, out_max, err);
                        fwrite(out_buf, 1, p_out - out_buf, F_out);
                    }
                    val--;
                }
            }
        }


        if (in != NULL) {
            fprintf(F_out, "\n        ]");
        }
    }
    else if (in != NULL && outer_type == CBOR_T_ARRAY && cdns_version == 1) {
        /* Block parameter in Array format */
        int rank = 0;

        fprintf(F_out, " [\n");
        if (val == CBOR_END_OF_ARRAY) {
            is_undef = 1;
            val = 0xffffffff;
        }

        while (val > 0 && in != NULL && in < in_max) {
            if (*in == 0xff) {
                fprintf(F_out, "        --end of array");
                if (is_undef) {
                    in++;
                }
                else {
                    fprintf(F_out, "        Error, end of array mark unexpected.\n");
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                break;
            }
            else {
                p_out = out_buf;
                fprintf(F_out, "            -- Block parameter %d:\n", rank);
                rank++;

                in = dump_block_parameters_rfc(in, in_max, out_buf, out_max, err, F_out);
                val--;
            }
        }

        if (in != NULL) {
            fprintf(F_out, "\n        ]");
        }
    }
    else {
        fprintf(F_out, "       Error, cannot parse the first bytes of block parameters (version %d), type %d.\n", cdns_version, outer_type);
        *err = CBOR_MALFORMED_VALUE;
        in = NULL;
    }

    return in;
}